

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  double dVar1;
  double dVar2;
  pointer pcVar3;
  undefined8 uVar4;
  unit_data uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Alloc_hider _Var9;
  precise_unit pVar10;
  __string_type __str_1;
  string fnd;
  __string_type __str;
  unit in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  double local_58;
  undefined8 local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  dVar1 = *(double *)this;
  dVar2 = un->multiplier_;
  uVar5 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_50 = CONCAT44(un->commodity_ | *(uint *)(this + 0xc),uVar5);
  local_58 = dVar1 * dVar2;
  find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
  if (local_b8._M_string_length == 0) {
    detail::unit_data::inv((unit_data *)&local_50);
    find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
    probeUnit_abi_cxx11_();
    if ((extraout_RAX & 1) == 0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(","");
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_48,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      local_98._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar7) {
        local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_98._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux(&local_98,local_98._M_string_length,0,1,'*');
      local_d8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar7) {
        local_d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_d8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_d8,(char *)un[1].multiplier_);
      local_f8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar7) {
        local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_f8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux(&local_f8,local_f8._M_string_length,0,1,')');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar7) {
        uVar4 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      _Var9._M_p = local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_003b0cde;
    }
    else {
      pVar10 = precise_unit::operator/((precise_unit *)this,un);
      local_50 = pVar10._8_8_;
      local_58 = pVar10.multiplier_;
      find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&local_b8,&local_f8);
      paVar7 = &local_f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar7) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8._M_string_length == 0) {
        detail::unit_data::inv((unit_data *)&local_50);
        find_unit_abi_cxx11_(in_stack_fffffffffffffef8);
        probeUnit_abi_cxx11_();
        if ((extraout_RAX_00 & 1) == 0) goto LAB_003b0cde;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,(char *)un[1].multiplier_,(allocator<char> *)&local_48);
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
                           (&local_98,local_98._M_string_length,0,1,'/');
        local_d8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == paVar7) {
          local_d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_d8._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_d8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar7) {
          uVar4 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        local_48.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
        _Var9._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_003b0cde;
      }
      else {
        local_f8._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(&local_f8,local_f8._M_string_length,0,1,'*');
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_f8,(char *)un[1].multiplier_);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (pbVar6->_M_dataplus)._M_p;
        paVar8 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar8) {
          uVar4 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        local_48.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
        _Var9._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == paVar7) goto LAB_003b0cde;
      }
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux(&local_78,local_78._M_string_length,0,1,'/');
    pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_78,(char *)un[1].multiplier_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar7) {
      uVar4 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    local_48.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
    _Var9._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_003b0cde;
  }
  operator_delete(_Var9._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_003b0cde:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}